

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
* __thiscall
ThreadContext::FindPropertyIdNoCase
          (ThreadContext *this,ScriptContext *scriptContext,CharacterBuffer<char16_t> *propertyName)

{
  bool bVar1;
  ThreadContext *local_30;
  CaseInvariantPropertyListWithHashCode *list;
  CharacterBuffer<char16_t> *propertyName_local;
  ScriptContext *scriptContext_local;
  ThreadContext *this_local;
  
  list = (CaseInvariantPropertyListWithHashCode *)propertyName;
  propertyName_local = (CharacterBuffer<char16_t> *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  if (this->caseInvariantPropertySet == (PropertyNoCaseSetType *)0x0) {
    CreateNoCasePropertyMap(this);
  }
  bVar1 = FindExistingPropertyRecord
                    (this,(CharacterBuffer<char16_t> *)list,
                     (CaseInvariantPropertyListWithHashCode **)&local_30);
  if (bVar1) {
    this_local = local_30;
  }
  else {
    this_local = (ThreadContext *)0x0;
  }
  return (List<const_Memory::RecyclerWeakReference<const_Js::PropertyRecord>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)this_local;
}

Assistant:

JsUtil::List<const RecyclerWeakReference<Js::PropertyRecord const>*>*
ThreadContext::FindPropertyIdNoCase(Js::ScriptContext * scriptContext, JsUtil::CharacterBuffer<WCHAR> const& propertyName)
{
    if (caseInvariantPropertySet == nullptr)
    {
        this->CreateNoCasePropertyMap();
    }
    Js::CaseInvariantPropertyListWithHashCode* list;
    if (FindExistingPropertyRecord(propertyName, &list))
    {
        return list;
    }
    return nullptr;
}